

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O1

_Bool ignore_sval_menu_action(menu_conflict *m,ui_event *event,wchar_t oid)

{
  uint32_t *puVar1;
  byte *pbVar2;
  _Bool _Var3;
  int iVar4;
  void *pvVar5;
  
  pvVar5 = menu_priv(m);
  if (event->type == EVT_SELECT) {
LAB_001fcce0:
    pbVar2 = (byte *)(*(long *)((long)pvVar5 + (long)oid * 0x10) + 0x2ba);
    *pbVar2 = *pbVar2 ^ 2U - *(char *)((long)pvVar5 + (long)oid * 0x10 + 8);
    puVar1 = &player->upkeep->notice;
    *puVar1 = *puVar1 | 2;
    _Var3 = true;
  }
  else {
    if (event->type == EVT_KBRD) {
      iVar4 = tolower((event->key).code);
      if (iVar4 == 0x74) goto LAB_001fcce0;
    }
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

static bool ignore_sval_menu_action(struct menu *m, const ui_event *event,
									int oid)
{
	const ignore_choice *choice = menu_priv(m);

	if (event->type == EVT_SELECT ||
			(event->type == EVT_KBRD && tolower(event->key.code) == 't')) {
		struct object_kind *kind = choice[oid].kind;

		/* Toggle the appropriate flag */
		if (choice[oid].aware)
			kind->ignore ^= IGNORE_IF_AWARE;
		else
			kind->ignore ^= IGNORE_IF_UNAWARE;

		player->upkeep->notice |= PN_IGNORE;
		return true;
	}

	return false;
}